

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nnls.h
# Opt level: O1

Scalar __thiscall
Eigen::NNLS<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::_max_Z
          (NNLS<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *this,RowVectorType *v)

{
  long lVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  float *pfVar5;
  long lVar6;
  long lVar7;
  char *__function;
  float fVar8;
  float fVar9;
  
  lVar7 = this->_Np;
  if ((lVar7 < 0) ||
     (lVar1 = (this->_P).m_indices.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows, lVar1 <= lVar7)) {
LAB_0017548b:
    __function = 
    "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<long, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<long, -1, 1>, Level = 0]"
    ;
  }
  else {
    plVar2 = (this->_P).m_indices.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    lVar3 = plVar2[lVar7];
    if ((-1 < lVar3) &&
       (lVar4 = (v->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage.m_rows,
       lVar3 < lVar4)) {
      pfVar5 = (v->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage.m_data;
      fVar8 = pfVar5[lVar3];
      lVar3 = (this->_A).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols;
      lVar7 = lVar7 + 1;
      fVar9 = fVar8;
      if (lVar7 < lVar3) {
        do {
          if ((lVar7 + -1 < -1) || (lVar1 <= lVar7)) goto LAB_0017548b;
          lVar6 = plVar2[lVar7];
          if ((lVar6 < 0) || (lVar4 <= lVar6)) goto LAB_001754a2;
          fVar8 = pfVar5[lVar6];
          if (fVar8 <= fVar9) {
            fVar8 = fVar9;
          }
          lVar7 = lVar7 + 1;
          fVar9 = fVar8;
        } while (lVar3 != lVar7);
      }
      return fVar8;
    }
LAB_001754a2:
    __function = 
    "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<float, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<float, -1, 1>, Level = 0]"
    ;
  }
  __assert_fail("index >= 0 && index < size()",
                "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/DenseCoeffsBase.h"
                ,0xb5,__function);
}

Assistant:

Scalar _max_Z(const RowVectorType &v) {
    const IndicesType &idxs = _P.indices();
    Scalar m = v(idxs(_Np));
    for (Index i=(_Np+1); i<_A.cols(); i++) {
      Index idx = idxs(i);
      if (m < v(idx)) { m = v(idx);}
    }
    return m;
  }